

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O1

int32_t * __thiscall
icu_63::ResourceDataValue::getIntVector
          (ResourceDataValue *this,int32_t *length,UErrorCode *errorCode)

{
  uint uVar1;
  anon_struct_8_2_41692a41 *paVar2;
  int32_t *piVar3;
  int32_t iVar4;
  
  iVar4 = 0;
  if (U_ZERO_ERROR < *errorCode) {
    return (int32_t *)0x0;
  }
  if ((this->res & 0xf0000000) == 0xe0000000) {
    uVar1 = this->res & 0xfffffff;
    if (uVar1 == 0) {
      paVar2 = &gEmpty32;
    }
    else {
      paVar2 = (anon_struct_8_2_41692a41 *)((ulong)(uVar1 << 2) + (long)this->pResData->pRoot);
    }
    iVar4 = paVar2->length;
    piVar3 = &paVar2->res;
  }
  else {
    piVar3 = (int32_t *)0x0;
  }
  *length = iVar4;
  if (piVar3 != (int32_t *)0x0) {
    return piVar3;
  }
  *errorCode = U_RESOURCE_TYPE_MISMATCH;
  return (int32_t *)0x0;
}

Assistant:

const int32_t *ResourceDataValue::getIntVector(int32_t &length, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    const int32_t *iv = res_getIntVector(pResData, res, &length);
    if(iv == NULL) {
        errorCode = U_RESOURCE_TYPE_MISMATCH;
    }
    return iv;
}